

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

void __thiscall cmDepends::Clear(cmDepends *this,string *file)

{
  cmGeneratedFileStream depFileStream;
  cmGeneratedFileStream cStack_278;
  
  if (this->Verbose == true) {
    cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[4]>
              ((string *)&cStack_278,(char (*) [27])"Clearing dependencies in \"",file,
               (char (*) [4])0x6b78cb);
    cmSystemTools::Stdout((string *)&cStack_278);
    std::__cxx11::string::~string((string *)&cStack_278);
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&cStack_278,file,false,None);
  std::operator<<((ostream *)&cStack_278,
                  "# Empty dependencies file\n# This may be replaced when dependencies are built.\n"
                 );
  cmGeneratedFileStream::~cmGeneratedFileStream(&cStack_278);
  return;
}

Assistant:

void cmDepends::Clear(const std::string& file) const
{
  // Print verbose output.
  if (this->Verbose) {
    cmSystemTools::Stdout(
      cmStrCat("Clearing dependencies in \"", file, "\".\n"));
  }

  // Write an empty dependency file.
  cmGeneratedFileStream depFileStream(file);
  depFileStream << "# Empty dependencies file\n"
                   "# This may be replaced when dependencies are built.\n";
}